

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaCorot_20::ComputeNF
          (ChElementHexaCorot_20 *this,double U,double V,double W,ChVectorDynamic<> *Qi,double *detJ
          ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  ShapeVector N;
  ShapeVector local_100;
  
  ShapeFunctions(this,&local_100,U,V,W);
  *detJ = this->Volume * 0.125;
  uVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < (long)uVar1) {
    uVar2 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (0 < (long)uVar2) {
      pdVar3 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar4 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      *pdVar4 = local_100.super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.m_storage.
                m_data.array[0] * *pdVar3;
      if (uVar1 == 1) goto LAB_006be8ef;
      if (uVar2 != 1) {
        pdVar4[1] = local_100.super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                    m_storage.m_data.array[0] * pdVar3[1];
        if (uVar1 < 3) goto LAB_006be8ef;
        if ((2 < uVar2) &&
           (pdVar4[2] = local_100.super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                        m_storage.m_data.array[0] * pdVar3[2], uVar2 != 3)) {
          pdVar4[3] = local_100.super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                      m_storage.m_data.array[1] * *pdVar3;
          if ((4 < uVar2) &&
             ((pdVar4[4] = local_100.super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                           m_storage.m_data.array[1] * pdVar3[1], uVar2 != 5 &&
              (pdVar4[5] = local_100.super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                           m_storage.m_data.array[1] * pdVar3[2], 6 < uVar2)))) {
            pdVar4[6] = local_100.super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                        m_storage.m_data.array[2] * *pdVar3;
            if ((uVar2 != 7) &&
               ((pdVar4[7] = local_100.
                             super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                             m_storage.m_data.array[2] * pdVar3[1], 8 < uVar2 &&
                (pdVar4[8] = local_100.
                             super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                             m_storage.m_data.array[2] * pdVar3[2], uVar2 != 9)))) {
              pdVar4[9] = local_100.super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                          m_storage.m_data.array[3] * *pdVar3;
              if ((10 < uVar2) &&
                 ((pdVar4[10] = local_100.
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                                m_storage.m_data.array[3] * pdVar3[1], uVar2 != 0xb &&
                  (pdVar4[0xb] = local_100.
                                 super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                                 m_storage.m_data.array[3] * pdVar3[2], 0xc < uVar2)))) {
                pdVar4[0xc] = local_100.
                              super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                              m_storage.m_data.array[4] * *pdVar3;
                if ((uVar2 != 0xd) &&
                   ((pdVar4[0xd] = local_100.
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                                   m_storage.m_data.array[4] * pdVar3[1], 0xe < uVar2 &&
                    (pdVar4[0xe] = local_100.
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                                   m_storage.m_data.array[4] * pdVar3[2], uVar2 != 0xf)))) {
                  pdVar4[0xf] = local_100.
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                                m_storage.m_data.array[5] * *pdVar3;
                  if ((0x10 < uVar2) &&
                     ((pdVar4[0x10] = local_100.
                                      super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                      .m_storage.m_data.array[5] * pdVar3[1], uVar2 != 0x11 &&
                      (pdVar4[0x11] = local_100.
                                      super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                      .m_storage.m_data.array[5] * pdVar3[2], 0x12 < uVar2)))) {
                    pdVar4[0x12] = local_100.
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                                   m_storage.m_data.array[6] * *pdVar3;
                    if ((uVar2 != 0x13) &&
                       ((pdVar4[0x13] = local_100.
                                        super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                        .m_storage.m_data.array[6] * pdVar3[1], 0x14 < uVar2 &&
                        (pdVar4[0x14] = local_100.
                                        super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                        .m_storage.m_data.array[6] * pdVar3[2], uVar2 != 0x15)))) {
                      pdVar4[0x15] = local_100.
                                     super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>.
                                     m_storage.m_data.array[7] * *pdVar3;
                      if ((0x16 < uVar2) &&
                         ((pdVar4[0x16] = local_100.
                                          super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                          .m_storage.m_data.array[7] * pdVar3[1], uVar2 != 0x17 &&
                          (pdVar4[0x17] = local_100.
                                          super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                          .m_storage.m_data.array[7] * pdVar3[2], 0x18 < uVar2)))) {
                        pdVar4[0x18] = local_100.
                                       super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                       .m_storage.m_data.array[8] * *pdVar3;
                        if ((uVar2 != 0x19) &&
                           ((pdVar4[0x19] = local_100.
                                            super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                            .m_storage.m_data.array[8] * pdVar3[1], 0x1a < uVar2 &&
                            (pdVar4[0x1a] = local_100.
                                            super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                            .m_storage.m_data.array[8] * pdVar3[2], uVar2 != 0x1b)))
                           ) {
                          pdVar4[0x1b] = local_100.
                                         super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                         .m_storage.m_data.array[9] * *pdVar3;
                          if ((0x1c < uVar2) &&
                             ((pdVar4[0x1c] = local_100.
                                              super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                              .m_storage.m_data.array[9] * pdVar3[1], uVar2 != 0x1d
                              && (pdVar4[0x1d] = local_100.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                 .m_storage.m_data.array[9] * pdVar3[2],
                                 0x1e < uVar2)))) {
                            pdVar4[0x1e] = local_100.
                                           super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                           .m_storage.m_data.array[10] * *pdVar3;
                            if ((uVar2 != 0x1f) &&
                               ((pdVar4[0x1f] = local_100.
                                                super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                .m_storage.m_data.array[10] * pdVar3[1],
                                0x20 < uVar2 &&
                                (pdVar4[0x20] = local_100.
                                                super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                .m_storage.m_data.array[10] * pdVar3[2],
                                uVar2 != 0x21)))) {
                              pdVar4[0x21] = local_100.
                                             super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                             .m_storage.m_data.array[0xb] * *pdVar3;
                              if ((0x22 < uVar2) &&
                                 ((pdVar4[0x22] = local_100.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0xb] * pdVar3[1],
                                  uVar2 != 0x23 &&
                                  (pdVar4[0x23] = local_100.
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0xb] * pdVar3[2],
                                  0x24 < uVar2)))) {
                                pdVar4[0x24] = local_100.
                                               super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                               .m_storage.m_data.array[0xc] * *pdVar3;
                                if ((uVar2 != 0x25) &&
                                   ((pdVar4[0x25] = local_100.
                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0xc] * pdVar3[1],
                                    0x26 < uVar2 &&
                                    (pdVar4[0x26] = local_100.
                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0xc] * pdVar3[2],
                                    uVar2 != 0x27)))) {
                                  pdVar4[0x27] = local_100.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                 .m_storage.m_data.array[0xd] * *pdVar3;
                                  if ((0x28 < uVar2) &&
                                     ((pdVar4[0x28] = local_100.
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0xd] * pdVar3[1],
                                      uVar2 != 0x29 &&
                                      (pdVar4[0x29] = local_100.
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0xd] * pdVar3[2],
                                      0x2a < uVar2)))) {
                                    pdVar4[0x2a] = local_100.
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0xe] * *pdVar3;
                                    if ((uVar2 != 0x2b) &&
                                       ((pdVar4[0x2b] = local_100.
                                                                                                                
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0xe] * pdVar3[1],
                                        0x2c < uVar2 &&
                                        (pdVar4[0x2c] = local_100.
                                                                                                                
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0xe] * pdVar3[2],
                                        uVar2 != 0x2d)))) {
                                      pdVar4[0x2d] = local_100.
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0xf] * *pdVar3;
                                      if ((0x2e < uVar2) &&
                                         ((pdVar4[0x2e] = local_100.
                                                                                                                    
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0xf] * pdVar3[1],
                                          uVar2 != 0x2f &&
                                          (pdVar4[0x2f] = local_100.
                                                                                                                    
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0xf] * pdVar3[2],
                                          0x30 < uVar2)))) {
                                        pdVar4[0x30] = local_100.
                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0x10] * *pdVar3;
                                        if ((uVar2 != 0x31) &&
                                           ((pdVar4[0x31] = local_100.
                                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0x10] * pdVar3[1],
                                            0x32 < uVar2 &&
                                            (pdVar4[0x32] = local_100.
                                                                                                                        
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0x10] * pdVar3[2],
                                            uVar2 != 0x33)))) {
                                          pdVar4[0x33] = local_100.
                                                                                                                  
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0x11] * *pdVar3;
                                          if ((0x34 < uVar2) &&
                                             ((pdVar4[0x34] = local_100.
                                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0x11] * pdVar3[1],
                                              uVar2 != 0x35 &&
                                              (pdVar4[0x35] = local_100.
                                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0x11] * pdVar3[2],
                                              0x36 < uVar2)))) {
                                            pdVar4[0x36] = local_100.
                                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0x12] * *pdVar3;
                                            if ((uVar2 != 0x37) &&
                                               ((pdVar4[0x37] = local_100.
                                                                                                                                
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0x12] * pdVar3[1],
                                                0x38 < uVar2 &&
                                                (pdVar4[0x38] = local_100.
                                                                                                                                
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0x12] * pdVar3[2],
                                                uVar2 != 0x39)))) {
                                              pdVar4[0x39] = local_100.
                                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0x13] * *pdVar3;
                                              if ((0x3a < uVar2) &&
                                                 (pdVar4[0x3a] = local_100.
                                                                                                                                  
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0x13] * pdVar3[1],
                                                 uVar2 != 0x3b)) {
                                                pdVar4[0x3b] = local_100.
                                                                                                                              
                                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>
                                                  .m_storage.m_data.array[0x13] * pdVar3[2];
                                                return;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_006be8ef:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChElementHexaCorot_20::ComputeNF(const double U,
                                      const double V,
                                      const double W,
                                      ChVectorDynamic<>& Qi,
                                      double& detJ,
                                      const ChVectorDynamic<>& F,
                                      ChVectorDynamic<>* state_x,
                                      ChVectorDynamic<>* state_w) {
    // evaluate shape functions (in compressed vector), btw. not dependant on state
    ShapeVector N;
    ShapeFunctions(N, U, V, W);  // note: U,V,W in -1..1 range

    detJ = this->GetVolume() / 8.0;

    Qi(0) = N(0) * F(0);
    Qi(1) = N(0) * F(1);
    Qi(2) = N(0) * F(2);
    Qi(3) = N(1) * F(0);
    Qi(4) = N(1) * F(1);
    Qi(5) = N(1) * F(2);
    Qi(6) = N(2) * F(0);
    Qi(7) = N(2) * F(1);
    Qi(8) = N(2) * F(2);
    Qi(9) = N(3) * F(0);
    Qi(10) = N(3) * F(1);
    Qi(11) = N(3) * F(2);
    Qi(12) = N(4) * F(0);
    Qi(13) = N(4) * F(1);
    Qi(14) = N(4) * F(2);
    Qi(15) = N(5) * F(0);
    Qi(16) = N(5) * F(1);
    Qi(17) = N(5) * F(2);
    Qi(18) = N(6) * F(0);
    Qi(19) = N(6) * F(1);
    Qi(20) = N(6) * F(2);
    Qi(21) = N(7) * F(0);
    Qi(22) = N(7) * F(1);
    Qi(23) = N(7) * F(2);
    Qi(24) = N(8) * F(0);
    Qi(25) = N(8) * F(1);
    Qi(26) = N(8) * F(2);
    Qi(27) = N(9) * F(0);
    Qi(28) = N(9) * F(1);
    Qi(29) = N(9) * F(2);
    Qi(30) = N(10) * F(0);
    Qi(31) = N(10) * F(1);
    Qi(32) = N(10) * F(2);
    Qi(33) = N(11) * F(0);
    Qi(34) = N(11) * F(1);
    Qi(35) = N(11) * F(2);
    Qi(36) = N(12) * F(0);
    Qi(37) = N(12) * F(1);
    Qi(38) = N(12) * F(2);
    Qi(39) = N(13) * F(0);
    Qi(40) = N(13) * F(1);
    Qi(41) = N(13) * F(2);
    Qi(42) = N(14) * F(0);
    Qi(43) = N(14) * F(1);
    Qi(44) = N(14) * F(2);
    Qi(45) = N(15) * F(0);
    Qi(46) = N(15) * F(1);
    Qi(47) = N(15) * F(2);
    Qi(48) = N(16) * F(0);
    Qi(49) = N(16) * F(1);
    Qi(50) = N(16) * F(2);
    Qi(51) = N(17) * F(0);
    Qi(52) = N(17) * F(1);
    Qi(53) = N(17) * F(2);
    Qi(54) = N(18) * F(0);
    Qi(55) = N(18) * F(1);
    Qi(56) = N(18) * F(2);
    Qi(57) = N(19) * F(0);
    Qi(58) = N(19) * F(1);
    Qi(59) = N(19) * F(2);
}